

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

Element * __thiscall
Rml::ElementDocument::FindNextTabElement
          (ElementDocument *this,Element *current_element,bool forward)

{
  int iVar1;
  CanFocus CVar2;
  Element *pEVar3;
  ElementDocument *pEVar4;
  ElementDocument *element;
  ElementDocument *element_00;
  undefined7 in_register_00000011;
  int i;
  int iVar5;
  int iVar6;
  bool bVar7;
  ElementDocument *this_00;
  int iVar8;
  
  if ((int)CONCAT71(in_register_00000011,forward) == 0) {
LAB_0028d657:
    element = Element::GetOwnerDocument(current_element);
    pEVar4 = (ElementDocument *)current_element;
    while (this_00 = pEVar4,
          pEVar4 = (ElementDocument *)Element::GetParentNode(&this_00->super_Element),
          this_00 != element) {
      iVar8 = 0;
      iVar5 = Element::GetNumChildren((Element *)pEVar4,false);
      iVar1 = 0;
      if (0 < iVar5) {
        iVar1 = iVar5;
      }
      bVar7 = false;
      for (; iVar5 = iVar5 + -1, iVar1 != iVar8; iVar8 = iVar8 + 1) {
        iVar6 = iVar5;
        if (forward) {
          iVar6 = iVar8;
        }
        element_00 = (ElementDocument *)Element::GetChild((Element *)pEVar4,iVar6);
        if ((bVar7) &&
           (pEVar3 = SearchFocusSubtree(this,(Element *)element_00,forward),
           pEVar3 != (Element *)0x0)) {
          return pEVar3;
        }
        bVar7 = (bool)(bVar7 | element_00 == this_00);
      }
    }
    if ((element == (ElementDocument *)current_element) ||
       (CVar2 = anon_unknown_0::CanFocusElement(&element->super_Element), pEVar4 = element,
       CVar2 != Yes)) {
      iVar5 = Element::GetNumChildren(&element->super_Element,false);
      iVar1 = 0;
      if (0 < iVar5) {
        iVar1 = iVar5;
      }
      iVar8 = 0;
      do {
        iVar5 = iVar5 + -1;
        if (iVar1 == iVar8) {
          return (Element *)0x0;
        }
        iVar6 = iVar5;
        if (forward) {
          iVar6 = iVar8;
        }
        pEVar3 = Element::GetChild(&element->super_Element,iVar6);
        pEVar4 = (ElementDocument *)SearchFocusSubtree(this,pEVar3,forward);
        iVar8 = iVar8 + 1;
      } while (pEVar4 == (ElementDocument *)0x0);
    }
  }
  else {
    iVar5 = 0;
    do {
      iVar1 = Element::GetNumChildren(current_element,false);
      if (iVar1 <= iVar5) goto LAB_0028d657;
      pEVar3 = Element::GetChild(current_element,iVar5);
      pEVar4 = (ElementDocument *)SearchFocusSubtree(this,pEVar3,true);
      iVar5 = iVar5 + 1;
    } while (pEVar4 == (ElementDocument *)0x0);
  }
  return &pEVar4->super_Element;
}

Assistant:

Element* ElementDocument::FindNextTabElement(Element* current_element, bool forward)
{
	// This algorithm is quite sneaky, I originally thought a depth first search would work, but it appears not. What is
	// required is to cut the tree in half along the nodes from current_element up the root and then either traverse the
	// tree in a clockwise or anticlock wise direction depending if you're searching forward or backward respectively.

	// If we're searching forward, check the immediate children of this node first off.
	if (forward)
	{
		for (int i = 0; i < current_element->GetNumChildren(); i++)
			if (Element* result = SearchFocusSubtree(current_element->GetChild(i), forward))
				return result;
	}

	// Now walk up the tree, testing either the bottom or top
	// of the tree, depending on whether we're going forward
	// or backward respectively.
	bool search_enabled = false;
	Element* document = current_element->GetOwnerDocument();
	Element* child = current_element;
	Element* parent = current_element->GetParentNode();
	while (child != document)
	{
		const int num_children = parent->GetNumChildren();
		for (int i = 0; i < num_children; i++)
		{
			// Calculate index into children
			const int child_index = forward ? i : (num_children - i - 1);
			Element* search_child = parent->GetChild(child_index);

			// Do a search if its enabled
			if (search_enabled)
				if (Element* result = SearchFocusSubtree(search_child, forward))
					return result;

			// Enable searching when we reach the child.
			if (search_child == child)
				search_enabled = true;
		}

		// Advance up the tree
		child = parent;
		parent = parent->GetParentNode();
		search_enabled = false;
	}

	// We could not find anything to focus along this direction.

	// If we can focus the document, then focus that now.
	if (current_element != document && CanFocusElement(document) == CanFocus::Yes)
		return document;

	// Otherwise, search the entire document tree. This way we will wrap around.
	const int num_children = document->GetNumChildren();
	for (int i = 0; i < num_children; i++)
	{
		const int child_index = forward ? i : (num_children - i - 1);
		if (Element* result = SearchFocusSubtree(document->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}